

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

int bssl::anon_unknown_0::QUICMethodTest::SetWriteSecretCallback
              (SSL *ssl,ssl_encryption_level_t level,SSL_CIPHER *cipher,uint8_t *secret,
              size_t secret_len)

{
  int *piVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  char *__s;
  ostream *poVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  
  if (_ZN4bssl12_GLOBAL__N_114QUICMethodTest8ex_data_E_0 < 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)SSL_get_ex_data((SSL *)ssl,_ZN4bssl12_GLOBAL__N_114QUICMethodTest8ex_data_E_0);
  }
  lVar4 = (long)(int)level;
  if (*(long *)(piVar1 + lVar4 * 0x14 + 0xe) == *(long *)(piVar1 + lVar4 * 0x14 + 0x10)) {
    if ((level == ssl_encryption_early_data) && (*piVar1 == 1)) {
      testing::Message::Message((Message *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"Unexpected early data write secret",0x22
                );
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1b31,"Failed");
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    }
    else {
      if (cipher != (SSL_CIPHER *)0x0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                   (piVar1 + lVar4 * 0x14 + 0xe),secret,secret + secret_len);
        uVar3 = SSL_CIPHER_get_id((SSL_CIPHER *)cipher);
        piVar1[lVar4 * 0x14 + 0x1a] = (int)uVar3;
        return 1;
      }
      testing::Message::Message((Message *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"Unexpected null cipher",0x16);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1b36,"Failed");
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    }
  }
  else {
    testing::Message::Message((Message *)&local_38);
    if (level < 4) {
      __s = *(char **)(&DAT_00430b08 + (ulong)level * 8);
    }
    else {
      __s = "<unknown>";
    }
    poVar5 = (ostream *)(local_38._M_head_impl + 0x10);
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10)," write secret configured twice",0x1e);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1b2c,"Failed");
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  return 0;
}

Assistant:

static int SetWriteSecretCallback(SSL *ssl, ssl_encryption_level_t level,
                                    const SSL_CIPHER *cipher,
                                    const uint8_t *secret, size_t secret_len) {
    return TransportFromSSL(ssl)->SetWriteSecret(level, cipher,
                                                 Span(secret, secret_len));
  }